

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O1

SRes LzmaEnc_SetProps(CLzmaEncHandle pp,CLzmaEncProps *props2)

{
  int iVar1;
  SRes SVar2;
  uint uVar3;
  CLzmaEncProps props;
  CLzmaEncProps local_48;
  
  local_48.writeEndMark = props2->writeEndMark;
  local_48.numThreads = props2->numThreads;
  local_48.level = props2->level;
  local_48.dictSize = props2->dictSize;
  local_48.reduceSize = props2->reduceSize;
  local_48.lc = props2->lc;
  local_48.lp = props2->lp;
  local_48.pb = props2->pb;
  local_48.algo = props2->algo;
  local_48.fb = props2->fb;
  local_48.btMode = props2->btMode;
  local_48.numHashBytes = props2->numHashBytes;
  local_48.mc = props2->mc;
  LzmaEncProps_Normalize(&local_48);
  SVar2 = 5;
  if ((local_48.dictSize < 0x60000001 && local_48.pb < 5) && (local_48.lp < 5 && local_48.lc < 9)) {
    *(UInt32 *)((long)pp + 0xac) = local_48.dictSize;
    uVar3 = 5;
    if (5 < (uint)local_48.fb) {
      uVar3 = local_48.fb;
    }
    if (0x110 < uVar3) {
      uVar3 = 0x111;
    }
    *(uint *)((long)pp + 0x44) = uVar3;
    *(int *)((long)pp + 0x60) = local_48.lc;
    *(int *)((long)pp + 100) = local_48.lp;
    *(int *)((long)pp + 0x68) = local_48.pb;
    *(uint *)((long)pp + 0x80) = (uint)(local_48.algo == 0);
    *(bool *)((long)pp + 0x121) = local_48.btMode != 0;
    if (local_48.btMode == 0) {
      iVar1 = 4;
    }
    else {
      iVar1 = 2;
      if ((1 < local_48.numHashBytes) && (iVar1 = 4, local_48.numHashBytes < 4)) {
        iVar1 = local_48.numHashBytes;
      }
    }
    *(int *)((long)pp + 0x15c) = iVar1;
    *(UInt32 *)((long)pp + 0x13c) = local_48.mc;
    *(uint *)((long)pp + 0x84) = local_48.writeEndMark;
    SVar2 = 0;
  }
  return SVar2;
}

Assistant:

SRes LzmaEnc_SetProps(CLzmaEncHandle pp, const CLzmaEncProps *props2)
{
  CLzmaEnc *p = (CLzmaEnc *)pp;
  CLzmaEncProps props = *props2;
  LzmaEncProps_Normalize(&props);

  if (props.lc > LZMA_LC_MAX
      || props.lp > LZMA_LP_MAX
      || props.pb > LZMA_PB_MAX
      || props.dictSize > ((UInt64)1 << kDicLogSizeMaxCompress)
      || props.dictSize > kMaxHistorySize)
    return SZ_ERROR_PARAM;

  p->dictSize = props.dictSize;
  {
    unsigned fb = props.fb;
    if (fb < 5)
      fb = 5;
    if (fb > LZMA_MATCH_LEN_MAX)
      fb = LZMA_MATCH_LEN_MAX;
    p->numFastBytes = fb;
  }
  p->lc = props.lc;
  p->lp = props.lp;
  p->pb = props.pb;
  p->fastMode = (props.algo == 0);
  p->matchFinderBase.btMode = (Byte)(props.btMode ? 1 : 0);
  {
    UInt32 numHashBytes = 4;
    if (props.btMode)
    {
      if (props.numHashBytes < 2)
        numHashBytes = 2;
      else if (props.numHashBytes < 4)
        numHashBytes = props.numHashBytes;
    }
    p->matchFinderBase.numHashBytes = numHashBytes;
  }

  p->matchFinderBase.cutValue = props.mc;

  p->writeEndMark = props.writeEndMark;

  #ifndef _7ZIP_ST
  /*
  if (newMultiThread != _multiThread)
  {
    ReleaseMatchFinder();
    _multiThread = newMultiThread;
  }
  */
  p->multiThread = (props.numThreads > 1);
  #endif

  return SZ_OK;
}